

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_record.cc
# Opt level: O1

uint64_t bssl::reconstruct_seqnum(uint16_t wire_seq,uint64_t seq_mask,uint64_t max_valid_seqnum)

{
  uint64_t uVar1;
  ulong uVar2;
  
  if (max_valid_seqnum >> 0x30 != 0) {
    __assert_fail("max_valid_seqnum <= DTLSRecordNumber::kMaxSequence",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/dtls_record.cc"
                  ,99,"uint64_t bssl::reconstruct_seqnum(uint16_t, uint64_t, uint64_t)");
  }
  if ((seq_mask != 0xff) && (seq_mask != 0xffff)) {
    __assert_fail("seq_mask == 0xff || seq_mask == 0xffff",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/dtls_record.cc"
                  ,100,"uint64_t bssl::reconstruct_seqnum(uint16_t, uint64_t, uint64_t)");
  }
  uVar2 = (ulong)wire_seq - (max_valid_seqnum + 1) & seq_mask;
  uVar1 = uVar2 + max_valid_seqnum + 1;
  if ((0xffffffffffff < uVar1) || (seq_mask + 1 >> 1 < uVar2 && seq_mask < uVar1)) {
    uVar1 = uVar1 - (seq_mask + 1);
  }
  if (uVar1 < 0x1000000000000) {
    return uVar1;
  }
  __assert_fail("seqnum <= DTLSRecordNumber::kMaxSequence",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/dtls_record.cc"
                ,0x76,"uint64_t bssl::reconstruct_seqnum(uint16_t, uint64_t, uint64_t)");
}

Assistant:

uint64_t reconstruct_seqnum(uint16_t wire_seq, uint64_t seq_mask,
                            uint64_t max_valid_seqnum) {
  // Although DTLS 1.3 can support sequence numbers up to 2^64-1, we continue to
  // enforce the DTLS 1.2 2^48-1 limit. With a minimal DTLS 1.3 record header (2
  // bytes), no payload, and 16 byte AEAD overhead, sending 2^48 records would
  // require 5 petabytes. This allows us to continue to pack a DTLS record
  // number into an 8-byte structure.
  assert(max_valid_seqnum <= DTLSRecordNumber::kMaxSequence);
  assert(seq_mask == 0xff || seq_mask == 0xffff);

  uint64_t max_seqnum_plus_one = max_valid_seqnum + 1;
  uint64_t diff = (wire_seq - max_seqnum_plus_one) & seq_mask;
  uint64_t step = seq_mask + 1;
  // This addition cannot overflow. It is at most 2^48 + seq_mask. It, however,
  // may exceed 2^48-1.
  uint64_t seqnum = max_seqnum_plus_one + diff;
  bool too_large = seqnum > DTLSRecordNumber::kMaxSequence;
  // If the diff is larger than half the step size, then the closest seqnum
  // to max_seqnum_plus_one (in Z_{2^64}) is seqnum minus step instead of
  // seqnum.
  bool closer_is_less = diff > step / 2;
  // Subtracting step from seqnum will cause underflow if seqnum is too small.
  bool would_underflow = seqnum < step;
  if (too_large || (closer_is_less && !would_underflow)) {
    seqnum -= step;
  }
  assert(seqnum <= DTLSRecordNumber::kMaxSequence);
  return seqnum;
}